

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O1

void __thiscall TadsListenerThread::~TadsListenerThread(TadsListenerThread *this)

{
  OS_Counter *pOVar1;
  OS_Listener *pOVar2;
  OS_Event *pOVar3;
  OS_Mutex *pOVar4;
  TadsServerThread *pTVar5;
  TadsServerThread *this_00;
  
  (this->super_OS_Thread).super_CVmWeakRefable.super_CVmRefCntObj._vptr_CVmRefCntObj =
       (_func_int **)&PTR__TadsListenerThread_00352ad0;
  (this->super_OS_Thread).super_OS_Waitable._vptr_OS_Waitable =
       (_func_int **)&PTR__TadsListenerThread_00352b08;
  pOVar2 = this->port;
  if (pOVar2 != (OS_Listener *)0x0) {
    LOCK();
    pOVar1 = &(pOVar2->super_OS_CoreSocket).super_CVmRefCntObj.cnt;
    (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1
    ;
    UNLOCK();
    if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
      (*(pOVar2->super_OS_CoreSocket).super_CVmRefCntObj._vptr_CVmRefCntObj[1])();
    }
  }
  pOVar3 = this->quit_evt;
  LOCK();
  pOVar1 = &(pOVar3->super_CVmRefCntObj).cnt;
  (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1;
  UNLOCK();
  if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
    (*(pOVar3->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])();
  }
  pOVar3 = this->shutdown_evt;
  LOCK();
  pOVar1 = &(pOVar3->super_CVmRefCntObj).cnt;
  (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1;
  UNLOCK();
  if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
    (*(pOVar3->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])();
  }
  pOVar4 = this->mutex;
  LOCK();
  pOVar1 = &(pOVar4->super_CVmRefCntObj).cnt;
  (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1;
  UNLOCK();
  if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
    (*(pOVar4->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])();
  }
  lib_free_str(this->errmsg);
  lib_free_str(this->password);
  this_00 = this->servers;
  while (this_00 != (TadsServerThread *)0x0) {
    pTVar5 = this_00->next_server;
    CVmWeakRefable::release_ref((CVmWeakRefable *)this_00);
    this_00 = pTVar5;
  }
  OS_Thread::~OS_Thread(&this->super_OS_Thread);
  return;
}

Assistant:

TadsListenerThread::~TadsListenerThread()
{
    /* release our port, if we have one */
    if (port != 0)
        port->release_ref();
    
    /* release our quit event and shutdown event */
    quit_evt->release_ref();
    shutdown_evt->release_ref();
    
    /* release our mutex */
    mutex->release_ref();
    
    /* free the error message string */
    lib_free_str(errmsg);

    /* free the password string */
    lib_free_str(password);
    
    /* 
     *   Release all of our server threads.  Note that we don't need to
     *   protect against concurrent access here because we know that no one
     *   has a reference to this object any longer - it's the only way we can
     *   be deleted.  
     */
    TadsServerThread *tcur, *tnxt;
    for (tcur = servers ; tcur != 0 ; tcur = tnxt)
    {
        /* remember the next one, and release this one */
        tnxt = tcur->next_server;
        tcur->release_ref();
    }
}